

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O2

void on_underlying_io_open_complete(void *context,IO_OPEN_RESULT open_result)

{
  int iVar1;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  size_t sVar2;
  uchar *source;
  STRING_HANDLE handle;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  bool bVar9;
  char proxy_basic [30];
  
  if (context == (void *)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    pcVar6 = "NULL context in on_underlying_io_open_complete";
    iVar1 = 0xfc;
LAB_0010a3e2:
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
               ,"on_underlying_io_open_complete",iVar1,1,pcVar6);
    return;
  }
  iVar1 = *context;
  if (iVar1 - 3U < 2) {
    (**(code **)((long)context + 0x18))(*(undefined8 *)((long)context + 0x20));
    return;
  }
  if (iVar1 == 1) {
    if (open_result == IO_OPEN_OK) {
      *(undefined4 *)context = 2;
      pcVar6 = *(char **)((long)context + 0x68);
      if (pcVar6 == (char *)0x0) {
LAB_0010a52d:
        handle = (STRING_HANDLE)0x0;
      }
      else {
        sVar2 = strlen(pcVar6);
        uVar8 = (int)sVar2 + 1;
        pcVar3 = *(char **)((long)context + 0x70);
        if (pcVar3 != (char *)0x0) {
          sVar2 = strlen(pcVar3);
          uVar8 = uVar8 + (int)sVar2;
        }
        if ((int)uVar8 < 0) {
LAB_0010a525:
          indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
          goto LAB_0010a52d;
        }
        source = (uchar *)malloc((ulong)uVar8 + 1);
        if (source == (uchar *)0x0) goto LAB_0010a525;
        pcVar5 = "";
        if (pcVar3 != (char *)0x0) {
          pcVar5 = pcVar3;
        }
        iVar1 = sprintf((char *)source,"%s:%s",pcVar6,pcVar5);
        if (iVar1 < 0) {
LAB_0010a50b:
          indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
          handle = (STRING_HANDLE)0x0;
        }
        else {
          handle = Azure_Base64_Encode_Bytes(source,(ulong)uVar8);
          if (handle == (STRING_HANDLE)0x0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                         ,"on_underlying_io_open_complete",0x15a,1,
                         "Cannot Base64 encode auth string");
            }
            goto LAB_0010a50b;
          }
        }
        free(source);
      }
      pcVar6 = *(char **)((long)context + 0x48);
      if ((pcVar6 == (char *)0x0) ||
         (handle == (STRING_HANDLE)0x0 && *(long *)((long)context + 0x68) != 0)) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                     ,"on_underlying_io_open_complete",0x16b,1,"Cannot create authorization header")
          ;
        }
        goto LAB_0010a762;
      }
      builtin_strncpy(proxy_basic + 0x10,"ation: Basic ",0xe);
      builtin_strncpy(proxy_basic,"\r\nProxy-authoriz",0x10);
      if (*(long *)((long)context + 0x68) == 0) {
        pcVar3 = "";
        bVar9 = true;
      }
      else {
        pcVar3 = STRING_c_str(handle);
        pcVar6 = *(char **)((long)context + 0x48);
        bVar9 = *(long *)((long)context + 0x68) == 0;
      }
      sVar2 = strlen(pcVar6);
      sVar4 = strlen(pcVar3);
      iVar1 = (int)sVar4 + (int)sVar2 * 2 + 0x27;
      if (bVar9) {
        iVar1 = (int)sVar4 + (int)sVar2 * 2 + 10;
      }
      if (iVar1 + 0x2a < 0) {
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar6 = "Cannot encode the CONNECT request";
          iVar1 = 0x188;
LAB_0010a70d:
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                     ,"on_underlying_io_open_complete",iVar1,1,pcVar6);
        }
      }
      else {
        pcVar5 = (char *)malloc((ulong)(iVar1 + 0x2b));
        if (pcVar5 != (char *)0x0) {
          pcVar7 = proxy_basic;
          if (bVar9) {
            pcVar7 = "";
          }
          uVar8 = sprintf(pcVar5,"CONNECT %s:%d HTTP/1.1\r\nHost:%s:%d%s%s\r\n\r\n",pcVar6,
                          (ulong)*(uint *)((long)context + 0x50),pcVar6,
                          (ulong)*(uint *)((long)context + 0x50),pcVar7,pcVar3);
          if ((int)uVar8 < 0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              pcVar6 = "Cannot encode the CONNECT request";
              iVar1 = 0x1a4;
LAB_0010a74b:
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                         ,"on_underlying_io_open_complete",iVar1,1,pcVar6);
            }
LAB_0010a750:
            indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
          }
          else {
            iVar1 = xio_send(*(XIO_HANDLE *)((long)context + 0x78),pcVar5,(ulong)uVar8,
                             unchecked_on_send_complete,(void *)0x0);
            if (iVar1 != 0) {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                pcVar6 = "Could not send CONNECT request";
                iVar1 = 0x1ad;
                goto LAB_0010a74b;
              }
              goto LAB_0010a750;
            }
          }
          free(pcVar5);
          goto LAB_0010a762;
        }
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
          pcVar6 = "Cannot allocate memory for CONNECT request";
          iVar1 = 0x193;
          goto LAB_0010a70d;
        }
      }
      indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
LAB_0010a762:
      if (handle != (STRING_HANDLE)0x0) {
        STRING_delete(handle);
      }
      return;
    }
    if (open_result == IO_OPEN_CANCELLED) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                   ,"on_underlying_io_open_complete",0x11f,1,"Underlying IO open failed");
      }
      *(undefined4 *)context = 0;
      xio_close(*(XIO_HANDLE *)((long)context + 0x78),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
      (**(code **)((long)context + 0x28))(*(undefined8 *)((long)context + 0x30),3);
      return;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_0010a465;
    pcVar6 = "Underlying IO open failed";
    iVar1 = 0x119;
  }
  else {
    if (iVar1 != 2) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
        return;
      }
      pcVar6 = "on_underlying_io_open_complete called in an unexpected state.";
      iVar1 = 0x104;
      goto LAB_0010a3e2;
    }
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_0010a465;
    pcVar6 = "Open complete called again by underlying IO.";
    iVar1 = 0x10f;
  }
  (*UNRECOVERED_JUMPTABLE)
            (AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
             ,"on_underlying_io_open_complete",iVar1,1,pcVar6);
LAB_0010a465:
  indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
  return;
}

Assistant:

static void on_underlying_io_open_complete(void* context, IO_OPEN_RESULT open_result)
{
    TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)context;

    if (tls_io_instance->tlsio_state == TLSIO_STATE_OPENING_UNDERLYING_IO)
    {
        if (open_result == IO_OPEN_OK)
        {
            tls_io_instance->tlsio_state = TLSIO_STATE_IN_HANDSHAKE;

            // Begin the handshake process here. It continues in on_underlying_io_bytes_received
            send_handshake_bytes(tls_io_instance);
        }
        else
        {
            LogError("Invalid open_result. Expected result is IO_OPEN_OK.");
            tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;
            indicate_open_complete(tls_io_instance, IO_OPEN_ERROR);
        }
    }
    else
    {
        LogError("Invalid tlsio_state. Expected state is TLSIO_STATE_OPENING_UNDERLYING_IO.");
    }
}